

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O0

size_t despace_ssse3_cumsum(void *dst_void,void *src_void,size_t length)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 *puVar15;
  size_t sVar16;
  long lVar17;
  size_t cnt1;
  size_t cnt0;
  __m128i v;
  __m128i t;
  __m128i s;
  __m128i d;
  __m128i c;
  __m128i b;
  __m128i a;
  __m128i mask_70;
  __m128i mask_20;
  __m128i mask_04;
  __m128i mask_02;
  __m128i id;
  __m128i lut_cntrl;
  __m128i is_3or7;
  size_t *local_5a0;
  uint8_t *dst;
  uint8_t *src;
  size_t length_local;
  void *src_void_local;
  void *dst_void_local;
  undefined8 local_118;
  
  auVar4 = vpinsrb_avx(ZEXT116(0),0,1);
  auVar4 = vpinsrb_avx(auVar4,0,2);
  auVar4 = vpinsrb_avx(auVar4,1,3);
  auVar4 = vpinsrb_avx(auVar4,0,4);
  auVar4 = vpinsrb_avx(auVar4,0,5);
  auVar4 = vpinsrb_avx(auVar4,0,6);
  auVar4 = vpinsrb_avx(auVar4,1,7);
  auVar4 = vpinsrb_avx(auVar4,0,8);
  auVar4 = vpinsrb_avx(auVar4,0,9);
  auVar4 = vpinsrb_avx(auVar4,0,10);
  auVar4 = vpinsrb_avx(auVar4,0,0xb);
  auVar4 = vpinsrb_avx(auVar4,0,0xc);
  auVar4 = vpinsrb_avx(auVar4,0,0xd);
  auVar4 = vpinsrb_avx(auVar4,0,0xe);
  auVar5 = vpinsrb_avx(auVar4,0,0xf);
  auVar4 = vpinsrb_avx(ZEXT116(0),0,1);
  auVar4 = vpinsrb_avx(auVar4,0,2);
  auVar4 = vpinsrb_avx(auVar4,0,3);
  auVar4 = vpinsrb_avx(auVar4,0,4);
  auVar4 = vpinsrb_avx(auVar4,0,5);
  auVar4 = vpinsrb_avx(auVar4,0,6);
  auVar4 = vpinsrb_avx(auVar4,0,7);
  auVar4 = vpinsrb_avx(auVar4,0,8);
  auVar4 = vpinsrb_avx(auVar4,1,9);
  auVar4 = vpinsrb_avx(auVar4,1,10);
  auVar4 = vpinsrb_avx(auVar4,0,0xb);
  auVar4 = vpinsrb_avx(auVar4,0,0xc);
  auVar4 = vpinsrb_avx(auVar4,1,0xd);
  auVar4 = vpinsrb_avx(auVar4,0,0xe);
  auVar6 = vpinsrb_avx(auVar4,0,0xf);
  auVar4 = vpinsrb_avx(ZEXT116(0),1,1);
  auVar4 = vpinsrb_avx(auVar4,2,2);
  auVar4 = vpinsrb_avx(auVar4,3,3);
  auVar4 = vpinsrb_avx(auVar4,4,4);
  auVar4 = vpinsrb_avx(auVar4,5,5);
  auVar4 = vpinsrb_avx(auVar4,6,6);
  auVar4 = vpinsrb_avx(auVar4,7,7);
  auVar4 = vpinsrb_avx(auVar4,8,8);
  auVar4 = vpinsrb_avx(auVar4,9,9);
  auVar4 = vpinsrb_avx(auVar4,10,10);
  auVar4 = vpinsrb_avx(auVar4,0xb,0xb);
  auVar4 = vpinsrb_avx(auVar4,0xc,0xc);
  auVar4 = vpinsrb_avx(auVar4,0xd,0xd);
  auVar4 = vpinsrb_avx(auVar4,0xe,0xe);
  auVar7 = vpinsrb_avx(auVar4,0xf,0xf);
  auVar4 = vpinsrb_avx(ZEXT116(2),2,1);
  auVar4 = vpinsrb_avx(auVar4,2,2);
  auVar4 = vpinsrb_avx(auVar4,2,3);
  auVar4 = vpinsrb_avx(auVar4,2,4);
  auVar4 = vpinsrb_avx(auVar4,2,5);
  auVar4 = vpinsrb_avx(auVar4,2,6);
  auVar4 = vpinsrb_avx(auVar4,2,7);
  auVar4 = vpinsrb_avx(auVar4,2,8);
  auVar4 = vpinsrb_avx(auVar4,2,9);
  auVar4 = vpinsrb_avx(auVar4,2,10);
  auVar4 = vpinsrb_avx(auVar4,2,0xb);
  auVar4 = vpinsrb_avx(auVar4,2,0xc);
  auVar4 = vpinsrb_avx(auVar4,2,0xd);
  auVar4 = vpinsrb_avx(auVar4,2,0xe);
  auVar8 = vpinsrb_avx(auVar4,2,0xf);
  auVar4 = vpaddb_avx(auVar8,auVar8);
  auVar10 = vpsllq_avx(auVar8,ZEXT416(4));
  auVar9 = vpinsrb_avx(ZEXT116(0x70),0x70,1);
  auVar9 = vpinsrb_avx(auVar9,0x70,2);
  auVar9 = vpinsrb_avx(auVar9,0x70,3);
  auVar9 = vpinsrb_avx(auVar9,0x70,4);
  auVar9 = vpinsrb_avx(auVar9,0x70,5);
  auVar9 = vpinsrb_avx(auVar9,0x70,6);
  auVar9 = vpinsrb_avx(auVar9,0x70,7);
  auVar9 = vpinsrb_avx(auVar9,0x70,8);
  auVar9 = vpinsrb_avx(auVar9,0x70,9);
  auVar9 = vpinsrb_avx(auVar9,0x70,10);
  auVar9 = vpinsrb_avx(auVar9,0x70,0xb);
  auVar9 = vpinsrb_avx(auVar9,0x70,0xc);
  auVar9 = vpinsrb_avx(auVar9,0x70,0xd);
  auVar9 = vpinsrb_avx(auVar9,0x70,0xe);
  auVar9 = vpinsrb_avx(auVar9,0x70,0xf);
  local_5a0 = (size_t *)dst_void;
  dst = (uint8_t *)src_void;
  for (src = (uint8_t *)length; (uint8_t *)0xf < src; src = src + -0x10) {
    auVar2 = *(undefined1 (*) [16])dst;
    auVar14 = *(undefined1 (*) [16])dst;
    auVar1 = *(undefined1 (*) [16])dst;
    dst = dst + 0x10;
    auVar2 = vpcmpeqb_avx(auVar10,auVar2);
    auVar2 = vpabsb_avx(auVar2);
    auVar1 = vpaddusb_avx(auVar9,auVar1);
    auVar1 = vpshufb_avx(auVar6,auVar1);
    auVar2 = vpor_avx(auVar2,auVar1);
    auVar1 = vpcmpeqb_avx(ZEXT816(0),auVar2);
    auVar11 = vpsllq_avx(auVar2,ZEXT416(8));
    auVar2 = vpaddb_avx(auVar2,auVar11);
    auVar11 = vpsllq_avx(auVar2,ZEXT416(0x10));
    auVar2 = vpaddb_avx(auVar2,auVar11);
    auVar11 = vpsllq_avx(auVar2,ZEXT416(0x20));
    auVar2 = vpaddb_avx(auVar2,auVar11);
    auVar11 = vpsrlq_avx(auVar2,ZEXT416(0x38));
    v[1] = auVar11._0_8_;
    lVar17 = 8 - v[1];
    auVar11 = vpunpckhqdq_avx(auVar11,auVar11);
    v[1] = auVar11._0_8_;
    auVar11 = vpandn_avx(auVar1,auVar2);
    auVar1 = vpand_avx(auVar8,auVar11);
    auVar12 = vpsrlq_avx(auVar1,ZEXT416(9));
    auVar1 = vpshufb_avx(auVar5,auVar11);
    auVar13 = vpsrlq_avx(auVar1,ZEXT416(0x10));
    auVar3 = vpcmpgtb_avx(auVar4,auVar2);
    auVar1 = vpcmpeqb_avx(auVar11,auVar4);
    auVar1 = vpor_avx(auVar3,auVar1);
    auVar2 = vpaddb_avx(auVar2,auVar12);
    auVar2 = vpaddb_avx(auVar2,auVar13);
    auVar1 = vpandn_avx(auVar1,auVar2);
    auVar1 = vpsrlq_avx(auVar1,ZEXT416(0x20));
    auVar2 = vpmaxub_avx(auVar2,auVar1);
    auVar2 = vpaddb_avx(auVar2,auVar7);
    auVar2 = vpshufb_avx(auVar14,auVar2);
    cnt0 = auVar2._0_8_;
    *local_5a0 = cnt0;
    puVar15 = (undefined8 *)((long)local_5a0 + lVar17);
    auVar2 = vpunpckhqdq_avx(auVar2,auVar2);
    local_118 = auVar2._0_8_;
    *puVar15 = local_118;
    local_5a0 = (size_t *)((8 - v[1]) + (long)puVar15);
  }
  sVar16 = despace_branchless(local_5a0,dst,(size_t)src);
  return (long)local_5a0 + (sVar16 - (long)dst_void);
}

Assistant:

size_t despace_ssse3_cumsum( void* dst_void, void* src_void, size_t length )
{
	uint8_t* src = (uint8_t*)src_void;
	uint8_t* dst = (uint8_t*)dst_void;

	const __m128i is_3or7 = _mm_setr_epi8(
		0x00, 0x00, 0x00, 0x01, 0x00, 0x00, 0x00, 0x01,
		0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00);
	const __m128i lut_cntrl = _mm_setr_epi8(
		0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
		0x00, 0x01, 0x01, 0x00, 0x00, 0x01, 0x00, 0x00);
	const __m128i id = _mm_setr_epi8(
		0x00, 0x01, 0x02, 0x03, 0x04, 0x05, 0x06, 0x07,
		0x08, 0x09, 0x0A, 0x0B, 0x0C, 0x0D, 0x0E, 0x0F);
	const __m128i mask_02 = _mm_set1_epi8(0x02);
	const __m128i mask_04 = _mm_add_epi8(mask_02, mask_02);
	const __m128i mask_20 = _mm_slli_epi64(mask_02, 4);
	const __m128i mask_70 = _mm_set1_epi8(0x70);

	for( ; length >= 16; length-=16 ){
		__m128i a,b,c,d,s,t,v;
		size_t cnt0, cnt1;

		// load
		v = _mm_loadu_si128((__m128i*)src);
		src += 16;

		// detect spaces ( 0x01 == space, 0x00 == non-space )
		s = _mm_or_si128(_mm_abs_epi8(_mm_cmpeq_epi8(mask_20, v)),
			_mm_shuffle_epi8(lut_cntrl, _mm_adds_epu8(mask_70, v)));

		// create non-space mask ( 0x00 == space, 0xFF == non-space )
		b = _mm_cmpeq_epi8(_mm_setzero_si128(), s);

		// (qword) prefix sum of spaces
		s = _mm_add_epi8(s, _mm_slli_epi64(s, 8));
		s = _mm_add_epi8(s, _mm_slli_epi64(s, 16));
		s = _mm_add_epi8(s, _mm_slli_epi64(s, 32));

		// get non-space byte totals
		t = _mm_srli_epi64(s, 56); // hi-byte is total_spaces
		cnt0 = 8 - _mm_cvtsi128_si64(t);
		t = _mm_unpackhi_epi64(t, t);
		cnt1 = 8 - _mm_cvtsi128_si64(t);

		// compress
		b = _mm_andnot_si128(b, s); // zero non-spaces
		//
		c = _mm_srli_epi64(_mm_and_si128(mask_02, b), 9);
		d = _mm_srli_epi64(_mm_shuffle_epi8(is_3or7, b), 16);
		a = _mm_or_si128(_mm_cmpgt_epi8(mask_04, s), _mm_cmpeq_epi8(b, mask_04)); // match first 4 and below
		//
		s = _mm_add_epi8(s, c);
		s = _mm_add_epi8(s, d);
		//
		s = _mm_max_epu8(s, _mm_srli_epi64(_mm_andnot_si128(a, s), 32));
		v = _mm_shuffle_epi8(v, _mm_add_epi8(s, id));

		// store
		_mm_storel_epi64((__m128i*)dst, v);
		dst += cnt0;
		_mm_storel_epi64((__m128i*)dst, _mm_unpackhi_epi64(v, v));
		dst += cnt1;
	}
	dst += despace_branchless(dst, src, length);
	return (size_t)(dst - ((uint8_t*)dst_void));
}